

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O1

void __thiscall Func::OnAddSym(Func *this,Sym *sym)

{
  uint32 varIndex;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JITTimeFunctionBody *this_00;
  
  if (sym == (Sym *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0x32d,"(sym)","sym");
    if (!bVar2) goto LAB_0042dd58;
    *puVar3 = 0;
  }
  bVar2 = JITTimeWorkItem::IsJitInDebugMode(this->m_workItem);
  if (bVar2) {
    varIndex = sym->m_id;
    this_00 = JITTimeWorkItem::GetJITFunctionBody(this->m_workItem);
    bVar2 = JITTimeFunctionBody::IsNonTempLocalVar(this_00,varIndex);
    if (bVar2) {
      if (this->m_nonTempLocalVars == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                           ,0x330,"(m_nonTempLocalVars)","m_nonTempLocalVars");
        if (!bVar2) {
LAB_0042dd58:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
      }
      BVSparse<Memory::JitArenaAllocator>::Set(this->m_nonTempLocalVars,sym->m_id);
      return;
    }
  }
  return;
}

Assistant:

void Func::OnAddSym(Sym* sym)
{
    Assert(sym);
    if (this->IsJitInDebugMode() && this->IsNonTempLocalVar(sym->m_id))
    {
        Assert(m_nonTempLocalVars);
        m_nonTempLocalVars->Set(sym->m_id);
    }
}